

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePath.h
# Opt level: O0

int __thiscall Js::TypePath::Add<false>(TypePath *this,PropertyRecord *propertyRecord)

{
  code *pcVar1;
  uint8 uVar2;
  uint8 uVar3;
  bool bVar4;
  int iVar5;
  undefined4 *puVar6;
  Data *pDVar7;
  PropertyRecord *propertyRecord_local;
  TypePath *this_local;
  
  uVar2 = GetPathLength(this);
  uVar3 = GetMaxInitializedLength(this);
  if (uVar2 != uVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypePath.h"
                                ,0x128,"(this->GetPathLength() == this->GetMaxInitializedLength())",
                                "this->GetPathLength() == this->GetMaxInitializedLength()");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pDVar7 = GetData(this);
  pDVar7->maxInitializedLength = pDVar7->maxInitializedLength + '\x01';
  iVar5 = AddInternal<true>(this,propertyRecord);
  return iVar5;
}

Assistant:

int Add(const PropertyRecord * propertyRecord)
        {
#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
            Assert(this->GetPathLength() == this->GetMaxInitializedLength());
            this->GetData()->maxInitializedLength++;
#endif
            return AddInternal<!isSetter>(propertyRecord);
        }